

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_context_get_device_info__alsa
                    (ma_context *pContext,ma_device_type deviceType,ma_device_id *pDeviceID,
                    ma_share_mode shareMode,ma_device_info *pDeviceInfo)

{
  uint uVar1;
  ma_result resultCode;
  int iVar2;
  size_t sVar3;
  undefined4 local_b4;
  void *pvStack_b0;
  int sampleRateDir;
  ma_snd_pcm_format_mask_t *pFormatMask;
  ma_snd_pcm_hw_params_t *pHWParams;
  ma_snd_pcm_t *pPCM;
  int resultALSA;
  ma_result result;
  ma_context_get_device_info_enum_callback_data__alsa data;
  ma_device_info *pDeviceInfo_local;
  ma_share_mode shareMode_local;
  ma_device_id *pDeviceID_local;
  ma_device_type deviceType_local;
  ma_context *pContext_local;
  void *p_1;
  void *p;
  
  local_b4 = 0;
  data._32_8_ = pDeviceInfo;
  if (pContext != (ma_context *)0x0) {
    data.pDeviceInfo._0_4_ = 0;
    resultALSA = deviceType;
    data._0_8_ = pDeviceID;
    data.pDeviceID._0_4_ = shareMode;
    data._16_8_ = pDeviceInfo;
    pPCM._4_4_ = ma_context_enumerate_devices__alsa
                           (pContext,ma_context_get_device_info_enum_callback__alsa,&resultALSA);
    pContext_local._4_4_ = pPCM._4_4_;
    if (pPCM._4_4_ == 0) {
      if ((int)data.pDeviceInfo == 0) {
        pContext_local._4_4_ = -0x68;
      }
      else {
        pPCM._4_4_ = ma_context_open_pcm__alsa
                               (pContext,shareMode,deviceType,pDeviceID,(ma_snd_pcm_t **)&pHWParams)
        ;
        pContext_local._4_4_ = pPCM._4_4_;
        if (pPCM._4_4_ == 0) {
          sVar3 = (*(pContext->field_21).alsa.snd_pcm_hw_params_sizeof)();
          pFormatMask = (ma_snd_pcm_format_mask_t *)
                        ma__malloc_from_callbacks(sVar3,&pContext->allocationCallbacks);
          if (pFormatMask == (ma_snd_pcm_format_mask_t *)0x0) {
            pContext_local._4_4_ = -4;
          }
          else {
            memset(pFormatMask,0,sVar3);
            pPCM._0_4_ = (*(pContext->field_21).alsa.snd_pcm_hw_params_any)(pHWParams,pFormatMask);
            if ((int)pPCM < 0) {
              ma__free_from_callbacks(pFormatMask,&pContext->allocationCallbacks);
              resultCode = ma_result_from_errno(-(int)pPCM);
              pContext_local._4_4_ =
                   ma_context_post_error
                             (pContext,(ma_device *)0x0,1,
                              "[ALSA] Failed to initialize hardware parameters. snd_pcm_hw_params_any() failed."
                              ,resultCode);
            }
            else {
              (*(pContext->field_21).alsa.snd_pcm_hw_params_get_channels_min)
                        (pFormatMask,data._32_8_ + 0x21c);
              (*(pContext->field_21).alsa.snd_pcm_hw_params_get_channels_max)
                        (pFormatMask,data._32_8_ + 0x220);
              (*(pContext->field_21).alsa.snd_pcm_hw_params_get_rate_min)
                        (pFormatMask,data._32_8_ + 0x224,&local_b4);
              (*(pContext->field_21).alsa.snd_pcm_hw_params_get_rate_max)
                        (pFormatMask,data._32_8_ + 0x228,&local_b4);
              sVar3 = (*(pContext->field_21).alsa.snd_pcm_format_mask_sizeof)();
              pvStack_b0 = ma__malloc_from_callbacks(sVar3,&pContext->allocationCallbacks);
              if (pvStack_b0 == (void *)0x0) {
                ma__free_from_callbacks(pFormatMask,&pContext->allocationCallbacks);
                pContext_local._4_4_ = -4;
              }
              else {
                memset(pvStack_b0,0,sVar3);
                (*(pContext->field_21).alsa.snd_pcm_hw_params_get_format_mask)
                          (pFormatMask,pvStack_b0);
                *(undefined4 *)(data._32_8_ + 0x200) = 0;
                iVar2 = (*(pContext->field_21).alsa.snd_pcm_format_mask_test)(pvStack_b0,1);
                if (iVar2 != 0) {
                  uVar1 = *(uint *)(data._32_8_ + 0x200);
                  *(uint *)(data._32_8_ + 0x200) = uVar1 + 1;
                  *(undefined4 *)(data._32_8_ + 0x204 + (ulong)uVar1 * 4) = 1;
                }
                iVar2 = (*(pContext->field_21).alsa.snd_pcm_format_mask_test)(pvStack_b0,2);
                if (iVar2 != 0) {
                  uVar1 = *(uint *)(data._32_8_ + 0x200);
                  *(uint *)(data._32_8_ + 0x200) = uVar1 + 1;
                  *(undefined4 *)(data._32_8_ + 0x204 + (ulong)uVar1 * 4) = 2;
                }
                iVar2 = (*(pContext->field_21).alsa.snd_pcm_format_mask_test)(pvStack_b0,0x20);
                if (iVar2 != 0) {
                  uVar1 = *(uint *)(data._32_8_ + 0x200);
                  *(uint *)(data._32_8_ + 0x200) = uVar1 + 1;
                  *(undefined4 *)(data._32_8_ + 0x204 + (ulong)uVar1 * 4) = 3;
                }
                iVar2 = (*(pContext->field_21).alsa.snd_pcm_format_mask_test)(pvStack_b0,10);
                if (iVar2 != 0) {
                  uVar1 = *(uint *)(data._32_8_ + 0x200);
                  *(uint *)(data._32_8_ + 0x200) = uVar1 + 1;
                  *(undefined4 *)(data._32_8_ + 0x204 + (ulong)uVar1 * 4) = 4;
                }
                iVar2 = (*(pContext->field_21).alsa.snd_pcm_format_mask_test)(pvStack_b0,0xe);
                if (iVar2 != 0) {
                  uVar1 = *(uint *)(data._32_8_ + 0x200);
                  *(uint *)(data._32_8_ + 0x200) = uVar1 + 1;
                  *(undefined4 *)(data._32_8_ + 0x204 + (ulong)uVar1 * 4) = 5;
                }
                ma__free_from_callbacks(pvStack_b0,&pContext->allocationCallbacks);
                ma__free_from_callbacks(pFormatMask,&pContext->allocationCallbacks);
                (*(pContext->field_21).alsa.snd_pcm_close)(pHWParams);
                pContext_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
    return pContext_local._4_4_;
  }
  __assert_fail("pContext != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x420d,
                "ma_result ma_context_get_device_info__alsa(ma_context *, ma_device_type, const ma_device_id *, ma_share_mode, ma_device_info *)"
               );
}

Assistant:

static ma_result ma_context_get_device_info__alsa(ma_context* pContext, ma_device_type deviceType, const ma_device_id* pDeviceID, ma_share_mode shareMode, ma_device_info* pDeviceInfo)
{
    ma_context_get_device_info_enum_callback_data__alsa data;
    ma_result result;
    int resultALSA;
    ma_snd_pcm_t* pPCM;
    ma_snd_pcm_hw_params_t* pHWParams;
    ma_snd_pcm_format_mask_t* pFormatMask;
    int sampleRateDir = 0;

    MA_ASSERT(pContext != NULL);

    /* We just enumerate to find basic information about the device. */
    data.deviceType = deviceType;
    data.pDeviceID = pDeviceID;
    data.shareMode = shareMode;
    data.pDeviceInfo = pDeviceInfo;
    data.foundDevice = MA_FALSE;
    result = ma_context_enumerate_devices__alsa(pContext, ma_context_get_device_info_enum_callback__alsa, &data);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (!data.foundDevice) {
        return MA_NO_DEVICE;
    }

    /* For detailed info we need to open the device. */
    result = ma_context_open_pcm__alsa(pContext, shareMode, deviceType, pDeviceID, &pPCM);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* We need to initialize a HW parameters object in order to know what formats are supported. */
    pHWParams = (ma_snd_pcm_hw_params_t*)ma__calloc_from_callbacks(((ma_snd_pcm_hw_params_sizeof_proc)pContext->alsa.snd_pcm_hw_params_sizeof)(), &pContext->allocationCallbacks);
    if (pHWParams == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    resultALSA = ((ma_snd_pcm_hw_params_any_proc)pContext->alsa.snd_pcm_hw_params_any)(pPCM, pHWParams);
    if (resultALSA < 0) {
        ma__free_from_callbacks(pHWParams, &pContext->allocationCallbacks);
        return ma_context_post_error(pContext, NULL, MA_LOG_LEVEL_ERROR, "[ALSA] Failed to initialize hardware parameters. snd_pcm_hw_params_any() failed.", ma_result_from_errno(-resultALSA));
    }

    ((ma_snd_pcm_hw_params_get_channels_min_proc)pContext->alsa.snd_pcm_hw_params_get_channels_min)(pHWParams, &pDeviceInfo->minChannels);
    ((ma_snd_pcm_hw_params_get_channels_max_proc)pContext->alsa.snd_pcm_hw_params_get_channels_max)(pHWParams, &pDeviceInfo->maxChannels);
    ((ma_snd_pcm_hw_params_get_rate_min_proc)pContext->alsa.snd_pcm_hw_params_get_rate_min)(pHWParams, &pDeviceInfo->minSampleRate, &sampleRateDir);
    ((ma_snd_pcm_hw_params_get_rate_max_proc)pContext->alsa.snd_pcm_hw_params_get_rate_max)(pHWParams, &pDeviceInfo->maxSampleRate, &sampleRateDir);

    /* Formats. */
    pFormatMask = (ma_snd_pcm_format_mask_t*)ma__calloc_from_callbacks(((ma_snd_pcm_format_mask_sizeof_proc)pContext->alsa.snd_pcm_format_mask_sizeof)(), &pContext->allocationCallbacks);
    if (pFormatMask == NULL) {
        ma__free_from_callbacks(pHWParams, &pContext->allocationCallbacks);
        return MA_OUT_OF_MEMORY;
    }

    ((ma_snd_pcm_hw_params_get_format_mask_proc)pContext->alsa.snd_pcm_hw_params_get_format_mask)(pHWParams, pFormatMask);

    pDeviceInfo->formatCount = 0;
    if (((ma_snd_pcm_format_mask_test_proc)pContext->alsa.snd_pcm_format_mask_test)(pFormatMask, MA_SND_PCM_FORMAT_U8)) {
        pDeviceInfo->formats[pDeviceInfo->formatCount++] = ma_format_u8;
    }
    if (((ma_snd_pcm_format_mask_test_proc)pContext->alsa.snd_pcm_format_mask_test)(pFormatMask, MA_SND_PCM_FORMAT_S16_LE)) {
        pDeviceInfo->formats[pDeviceInfo->formatCount++] = ma_format_s16;
    }
    if (((ma_snd_pcm_format_mask_test_proc)pContext->alsa.snd_pcm_format_mask_test)(pFormatMask, MA_SND_PCM_FORMAT_S24_3LE)) {
        pDeviceInfo->formats[pDeviceInfo->formatCount++] = ma_format_s24;
    }
    if (((ma_snd_pcm_format_mask_test_proc)pContext->alsa.snd_pcm_format_mask_test)(pFormatMask, MA_SND_PCM_FORMAT_S32_LE)) {
        pDeviceInfo->formats[pDeviceInfo->formatCount++] = ma_format_s32;
    }
    if (((ma_snd_pcm_format_mask_test_proc)pContext->alsa.snd_pcm_format_mask_test)(pFormatMask, MA_SND_PCM_FORMAT_FLOAT_LE)) {
        pDeviceInfo->formats[pDeviceInfo->formatCount++] = ma_format_f32;
    }

    ma__free_from_callbacks(pFormatMask, &pContext->allocationCallbacks);
    ma__free_from_callbacks(pHWParams, &pContext->allocationCallbacks);

    ((ma_snd_pcm_close_proc)pContext->alsa.snd_pcm_close)(pPCM);
    return MA_SUCCESS;
}